

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_ParseFloat_Test::TestBody
          (TokenizerTest_ParseFloat_Test *this)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  _Alloc_hider _Var8;
  double dVar9;
  ReturnSentinel gtest_sentinel;
  AssertionResult gtest_ar;
  string local_a8;
  allocator<char> local_81;
  double local_80;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1.",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1.\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3e6,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1e3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1e3","Tokenizer::ParseFloat(\"1e3\")",1000.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,999,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1E3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1e3","Tokenizer::ParseFloat(\"1E3\")",1000.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,1000,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1.5e3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.5e3","Tokenizer::ParseFloat(\"1.5e3\")",1500.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3e9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,".1",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,".1","Tokenizer::ParseFloat(\".1\")",0.1,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3ea,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,".25",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,".25","Tokenizer::ParseFloat(\".25\")",0.25,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3eb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,".1e3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,".1e3","Tokenizer::ParseFloat(\".1e3\")",100.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3ec,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,".25e3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,".25e3","Tokenizer::ParseFloat(\".25e3\")",250.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3ed,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,".1e+3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,".1e+3","Tokenizer::ParseFloat(\".1e+3\")",100.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3ee,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,".1e-3",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,".1e-3","Tokenizer::ParseFloat(\".1e-3\")",0.0001,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3ef,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"5",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"5","Tokenizer::ParseFloat(\"5\")",5.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"6e-12",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"6e-12","Tokenizer::ParseFloat(\"6e-12\")",6e-12,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1.2",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.2","Tokenizer::ParseFloat(\"1.2\")",1.2,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1.e2",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1.e2","Tokenizer::ParseFloat(\"1.e2\")",100.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1e",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1e\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f6,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1e-",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1e-\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1.e",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1.e\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3f8,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1f",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1f\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3fb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1.0f",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1.0f\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3fc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1F",(allocator<char> *)&gtest_sentinel);
  dVar9 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"1","Tokenizer::ParseFloat(\"1F\")",1.0,dVar9);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x3fd,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_sentinel.test_ = (DeathTest *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1e-9999999999999999999999999999",&local_81);
  local_80 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0",
             "Tokenizer::ParseFloat(\"1e-9999999999999999999999999999\")",(double *)&gtest_sentinel,
             &local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x401,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_sentinel.test_ = (DeathTest *)&DAT_7ff0000000000000;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"1e+9999999999999999999999999999",&local_81);
  local_80 = Tokenizer::ParseFloat(&local_a8);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"(__builtin_huge_val ())",
             "Tokenizer::ParseFloat(\"1e+9999999999999999999999999999\")",(double *)&gtest_sentinel,
             &local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x402,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&local_a8)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("Tokenizer::ParseFloat(\"zxy\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                       ,0x408,(DeathTest **)&gtest_ar);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    if (!bVar3) goto LAB_008ed00a;
    _Var8._M_p = (pointer)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    if ((long *)_Var8._M_p != (long *)0x0) {
      iVar5 = (**(code **)(*(long *)_Var8._M_p + 0x10))(_Var8._M_p);
      if (iVar5 == 0) {
        plVar1 = (long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        iVar5 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_p + 8))(_Var8._M_p);
          goto LAB_008ed00a;
        }
      }
      else if (iVar5 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"zxy",(allocator<char> *)&local_80);
          Tokenizer::ParseFloat(&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
        }
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 0x28))
                  ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar7 = *(long *)_Var8._M_p;
      goto LAB_008ed05b;
    }
  }
  else {
LAB_008ed00a:
    testing::Message::Message((Message *)&local_a8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x408,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      lVar7 = *(long *)local_a8._M_dataplus._M_p;
      _Var8._M_p = local_a8._M_dataplus._M_p;
LAB_008ed05b:
      (**(code **)(lVar7 + 8))(_Var8._M_p);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("Tokenizer::ParseFloat(\"1-e0\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                       ,0x40b,(DeathTest **)&gtest_ar);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    if (!bVar3) goto LAB_008ed160;
    _Var8._M_p = (pointer)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
    if ((long *)_Var8._M_p != (long *)0x0) {
      iVar5 = (**(code **)(*(long *)_Var8._M_p + 0x10))(_Var8._M_p);
      if (iVar5 == 0) {
        plVar1 = (long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        iVar5 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*(long *)_Var8._M_p + 8))(_Var8._M_p);
          goto LAB_008ed160;
        }
      }
      else if (iVar5 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"1-e0",(allocator<char> *)&local_80);
          Tokenizer::ParseFloat(&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
        }
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 0x28))
                  ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar7 = *(long *)_Var8._M_p;
      goto LAB_008ed1b1;
    }
  }
  else {
LAB_008ed160:
    testing::Message::Message((Message *)&local_a8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x40b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      lVar7 = *(long *)local_a8._M_dataplus._M_p;
      _Var8._M_p = local_a8._M_dataplus._M_p;
LAB_008ed1b1:
      (**(code **)(lVar7 + 8))(_Var8._M_p);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("Tokenizer::ParseFloat(\"-1.0\")",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                       ,0x40e,(DeathTest **)&gtest_ar);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    if (bVar3) {
      plVar1 = (long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      if (plVar1 == (long *)0x0) {
        return;
      }
      iVar5 = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (iVar5 == 0) {
        plVar2 = (long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        iVar5 = (**(code **)(*plVar2 + 0x18))(plVar2);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(*plVar1 + 8))(plVar1);
          goto LAB_008ed2b6;
        }
      }
      else if (iVar5 == 1) {
        gtest_sentinel.test_ = (DeathTest *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"-1.0",(allocator<char> *)&local_80);
          Tokenizer::ParseFloat(&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
        }
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 0x28))
                  ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      lVar7 = *plVar1;
      local_a8._M_dataplus._M_p = (pointer)plVar1;
      goto LAB_008ed307;
    }
  }
LAB_008ed2b6:
  testing::Message::Message((Message *)&local_a8);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
             ,0x40e,pcVar6);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  if ((long *)local_a8._M_dataplus._M_p == (long *)0x0) {
    return;
  }
  lVar7 = *(long *)local_a8._M_dataplus._M_p;
LAB_008ed307:
  (**(code **)(lVar7 + 8))(local_a8._M_dataplus._M_p);
  return;
}

Assistant:

TEST_F(TokenizerTest, ParseFloat) {
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1."));
  EXPECT_DOUBLE_EQ(1e3, Tokenizer::ParseFloat("1e3"));
  EXPECT_DOUBLE_EQ(1e3, Tokenizer::ParseFloat("1E3"));
  EXPECT_DOUBLE_EQ(1.5e3, Tokenizer::ParseFloat("1.5e3"));
  EXPECT_DOUBLE_EQ(.1, Tokenizer::ParseFloat(".1"));
  EXPECT_DOUBLE_EQ(.25, Tokenizer::ParseFloat(".25"));
  EXPECT_DOUBLE_EQ(.1e3, Tokenizer::ParseFloat(".1e3"));
  EXPECT_DOUBLE_EQ(.25e3, Tokenizer::ParseFloat(".25e3"));
  EXPECT_DOUBLE_EQ(.1e+3, Tokenizer::ParseFloat(".1e+3"));
  EXPECT_DOUBLE_EQ(.1e-3, Tokenizer::ParseFloat(".1e-3"));
  EXPECT_DOUBLE_EQ(5, Tokenizer::ParseFloat("5"));
  EXPECT_DOUBLE_EQ(6e-12, Tokenizer::ParseFloat("6e-12"));
  EXPECT_DOUBLE_EQ(1.2, Tokenizer::ParseFloat("1.2"));
  EXPECT_DOUBLE_EQ(1.e2, Tokenizer::ParseFloat("1.e2"));

  // Test invalid integers that may still be tokenized as integers.
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1e"));
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1e-"));
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1.e"));

  // Test 'f' suffix.
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1f"));
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1.0f"));
  EXPECT_DOUBLE_EQ(1, Tokenizer::ParseFloat("1F"));

  // These should parse successfully even though they are out of range.
  // Overflows become infinity and underflows become zero.
  EXPECT_EQ(0.0, Tokenizer::ParseFloat("1e-9999999999999999999999999999"));
  EXPECT_EQ(HUGE_VAL, Tokenizer::ParseFloat("1e+9999999999999999999999999999"));

#if GTEST_HAS_DEATH_TEST  // death tests do not work on Windows yet
  // Test invalid integers that will never be tokenized as integers.
  EXPECT_DEBUG_DEATH(
      Tokenizer::ParseFloat("zxy"),
      "passed text that could not have been tokenized as a float");
  EXPECT_DEBUG_DEATH(
      Tokenizer::ParseFloat("1-e0"),
      "passed text that could not have been tokenized as a float");
  EXPECT_DEBUG_DEATH(
      Tokenizer::ParseFloat("-1.0"),
      "passed text that could not have been tokenized as a float");
#endif  // GTEST_HAS_DEATH_TEST
}